

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

uchar __thiscall IDisk::GetNextByteForRev(IDisk *this,int side,uint track,uint offset,int rev)

{
  uint uVar1;
  Revolution *pRVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = offset + 1;
  pRVar2 = this->side_[side].tracks[track].revolution;
  uVar1 = pRVar2[rev].size;
  bVar3 = 0;
  for (uVar5 = 0; uVar5 < 0x10; uVar5 = uVar5 + 2) {
    uVar6 = uVar1;
    if (uVar4 < uVar1) {
      uVar6 = 0;
    }
    bVar3 = bVar3 * '\x02' | pRVar2[rev].bitfield[uVar4 - uVar6] & 1;
    uVar4 = (uVar4 - uVar6) + 2;
  }
  return bVar3;
}

Assistant:

unsigned char IDisk::GetNextByteForRev(int side, unsigned int track, unsigned int offset, int rev)
{
   unsigned char return_value = 0;

   //
   offset++;
   for (int i = 0; i < 16; i += 2)
   {
      return_value <<= 1;
      if (offset >= side_[side].tracks[track].revolution[rev].size)
         offset = offset - side_[side].tracks[track].revolution[rev].size;

      unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[offset];

      return_value |= b & 0x1;
      offset += 2;
   }

   return return_value;
}